

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *pIVar2;
  ImGuiWindow *pIVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  
  pIVar1 = GImGui->NavWindow;
  if (pIVar1 != (ImGuiWindow *)0x0) {
    if ((flags & 4U) != 0) {
      return true;
    }
    pIVar2 = GImGui->CurrentWindow;
    if (pIVar2 == (ImGuiWindow *)0x0) {
      __assert_fail("cur_window",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/imgui-src/imgui.cpp"
                    ,0x1dbf,"bool ImGui::IsWindowFocused(ImGuiFocusedFlags)");
    }
    pIVar3 = pIVar2;
    if ((flags & 2U) != 0) {
      do {
        pIVar2 = pIVar3->RootWindow;
        if ((flags & 8U) == 0) {
          pIVar2 = pIVar2->RootWindowPopupTree;
        }
        if ((flags & 0x10U) != 0) {
          pIVar2 = pIVar2->RootWindowDockTree;
        }
        bVar5 = pIVar3 != pIVar2;
        pIVar3 = pIVar2;
      } while (bVar5);
    }
    pIVar3 = pIVar1;
    if ((flags & 1U) == 0) {
      return pIVar1 == pIVar2;
    }
    do {
      pIVar4 = pIVar3->RootWindow;
      if ((flags & 8U) == 0) {
        pIVar4 = pIVar4->RootWindowPopupTree;
      }
      if ((flags & 0x10U) != 0) {
        pIVar4 = pIVar4->RootWindowDockTree;
      }
      bVar5 = pIVar3 != pIVar4;
      pIVar3 = pIVar4;
    } while (bVar5);
    if (pIVar4 == pIVar2) {
      return true;
    }
    do {
      bVar5 = pIVar1 == pIVar2;
      if (bVar5) {
        return bVar5;
      }
      if (pIVar1 == pIVar4) {
        return bVar5;
      }
      pIVar1 = pIVar1->ParentWindow;
    } while (pIVar1 != (ImGuiWindow *)0x0);
  }
  return false;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    const bool dock_hierarchy = (flags & ImGuiFocusedFlags_DockHierarchy) != 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy, dock_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy, dock_hierarchy);
    else
        return (ref_window == cur_window);
}